

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

Socket * ssh_connection_sharing_init
                   (char *host,int port,Conf *conf,LogContext *logctx,Plug *sshplug,
                   ssh_sharing_state **state)

{
  _Bool _Var1;
  ssh_sharing_state *ptr;
  tree234 *ptVar2;
  ssh_sharing_state *sharestate;
  Socket *toret;
  Socket *sock;
  char *sockname;
  char *us_err;
  char *ds_err;
  char *logtext;
  _Bool can_downstream;
  _Bool can_upstream;
  ssh_sharing_state **ppsStack_40;
  int result;
  ssh_sharing_state **state_local;
  Plug *sshplug_local;
  LogContext *logctx_local;
  Conf *conf_local;
  char *pcStack_18;
  int port_local;
  char *host_local;
  
  sharestate = (ssh_sharing_state *)0x0;
  ppsStack_40 = state;
  state_local = (ssh_sharing_state **)sshplug;
  sshplug_local = (Plug *)logctx;
  logctx_local = (LogContext *)conf;
  conf_local._4_4_ = port;
  pcStack_18 = host;
  _Var1 = conf_get_bool(conf,0xc0);
  if (_Var1) {
    logtext._3_1_ = 0;
    logtext._2_1_ = conf_get_bool((Conf *)logctx_local,0xc2);
    if (((logtext._3_1_ & 1) != 0) || ((bool)logtext._2_1_)) {
      sock = (Socket *)ssh_share_sockname(pcStack_18,conf_local._4_4_,(Conf *)logctx_local);
      ptr = (ssh_sharing_state *)safemalloc(1,0x38,0);
      (ptr->plug).vt = &ssh_sharing_listen_plugvt;
      ptr->listensock = (Socket *)0x0;
      ptr->cl = (ConnectionLayer *)0x0;
      toret = (Socket *)0x0;
      sockname = (char *)0x0;
      us_err = (char *)0x0;
      ds_err = (char *)0x0;
      logtext._4_4_ =
           platform_ssh_share((char *)sock,(Conf *)logctx_local,(Plug *)state_local,&ptr->plug,
                              &toret,&ds_err,&us_err,&sockname,(_Bool)(logtext._3_1_ & 1),
                              (_Bool)(logtext._2_1_ & 1));
      if (logtext._4_4_ == 0) {
        if (ds_err == (char *)0x0) {
          if (us_err != (char *)0x0) {
            logeventf((LogContext *)sshplug_local,
                      "Could not set up connection sharing as downstream: %s",us_err);
          }
          if (sockname != (char *)0x0) {
            logeventf((LogContext *)sshplug_local,
                      "Could not set up connection sharing as upstream: %s",sockname);
          }
        }
        else {
          logeventf((LogContext *)sshplug_local,"Could not set up connection sharing: %s",ds_err);
        }
        if (toret != (Socket *)0x0) {
          __assert_fail("sock == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c"
                        ,0x857,
                        "Socket *ssh_connection_sharing_init(const char *, int, Conf *, LogContext *, Plug *, ssh_sharing_state **)"
                       );
        }
        *ppsStack_40 = (ssh_sharing_state *)0x0;
        safefree(ptr);
        safefree(sock);
      }
      else if (logtext._4_4_ == 1) {
        logeventf((LogContext *)sshplug_local,"Using existing shared connection at %s",ds_err);
        *ppsStack_40 = (ssh_sharing_state *)0x0;
        safefree(ptr);
        safefree(sock);
        sharestate = (ssh_sharing_state *)toret;
      }
      else if (logtext._4_4_ == 2) {
        logeventf((LogContext *)sshplug_local,"Sharing this connection at %s",ds_err);
        *ppsStack_40 = ptr;
        ptr->listensock = toret;
        ptVar2 = newtree234(share_connstate_cmp);
        ptr->connections = ptVar2;
        ptr->server_verstring = (char *)0x0;
        ptr->sockname = (char *)sock;
        ptr->nextid = 1;
      }
      safefree(ds_err);
      safefree(us_err);
      safefree(sockname);
      host_local = (char *)sharestate;
    }
    else {
      host_local = (char *)0x0;
    }
  }
  else {
    host_local = (char *)0x0;
  }
  return (Socket *)host_local;
}

Assistant:

Socket *ssh_connection_sharing_init(
    const char *host, int port, Conf *conf, LogContext *logctx,
    Plug *sshplug, ssh_sharing_state **state)
{
    int result;
    bool can_upstream, can_downstream;
    char *logtext, *ds_err, *us_err;
    char *sockname;
    Socket *sock, *toret = NULL;
    struct ssh_sharing_state *sharestate;

    if (!conf_get_bool(conf, CONF_ssh_connection_sharing))
        return NULL;                   /* do not share anything */
    can_upstream = share_can_be_upstream &&
        conf_get_bool(conf, CONF_ssh_connection_sharing_upstream);
    can_downstream = share_can_be_downstream &&
        conf_get_bool(conf, CONF_ssh_connection_sharing_downstream);
    if (!can_upstream && !can_downstream)
        return NULL;

    sockname = ssh_share_sockname(host, port, conf);

    /*
     * Create a data structure for the listening plug if we turn out
     * to be an upstream.
     */
    sharestate = snew(struct ssh_sharing_state);
    sharestate->plug.vt = &ssh_sharing_listen_plugvt;
    sharestate->listensock = NULL;
    sharestate->cl = NULL;

    /*
     * Now hand off to a per-platform routine that either connects to
     * an existing upstream (using 'ssh' as the plug), establishes our
     * own upstream (using 'sharestate' as the plug), or forks off a
     * separate upstream and then connects to that. It will return a
     * code telling us which kind of socket it put in 'sock'.
     */
    sock = NULL;
    logtext = ds_err = us_err = NULL;
    result = platform_ssh_share(
        sockname, conf, sshplug, &sharestate->plug, &sock, &logtext,
        &ds_err, &us_err, can_upstream, can_downstream);
    switch (result) {
      case SHARE_NONE:
        /*
         * We aren't sharing our connection at all (e.g. something
         * went wrong setting the socket up). Free the upstream
         * structure and return NULL.
         */

        if (logtext) {
            /* For this result, if 'logtext' is not NULL then it is an
             * error message indicating a reason why connection sharing
             * couldn't be set up _at all_ */
            logeventf(logctx,
                      "Could not set up connection sharing: %s", logtext);
        } else {
            /* Failing that, ds_err and us_err indicate why we
             * couldn't be a downstream and an upstream respectively */
            if (ds_err)
                logeventf(logctx, "Could not set up connection sharing"
                          " as downstream: %s", ds_err);
            if (us_err)
                logeventf(logctx, "Could not set up connection sharing"
                          " as upstream: %s", us_err);
        }

        assert(sock == NULL);
        *state = NULL;
        sfree(sharestate);
        sfree(sockname);
        break;

      case SHARE_DOWNSTREAM:
        /*
         * We are downstream, so free sharestate which it turns out we
         * don't need after all, and return the downstream socket as a
         * replacement for an ordinary SSH connection.
         */

        /* 'logtext' is a local endpoint address */
        logeventf(logctx, "Using existing shared connection at %s", logtext);

        *state = NULL;
        sfree(sharestate);
        sfree(sockname);
        toret = sock;
        break;

      case SHARE_UPSTREAM:
        /*
         * We are upstream. Set up sharestate properly and pass a copy
         * to the caller; return NULL, to tell ssh.c that it has to
         * make an ordinary connection after all.
         */

        /* 'logtext' is a local endpoint address */
        logeventf(logctx, "Sharing this connection at %s", logtext);

        *state = sharestate;
        sharestate->listensock = sock;
        sharestate->connections = newtree234(share_connstate_cmp);
        sharestate->server_verstring = NULL;
        sharestate->sockname = sockname;
        sharestate->nextid = 1;
        break;
    }

    sfree(logtext);
    sfree(ds_err);
    sfree(us_err);
    return toret;
}